

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

bool __thiscall soplex::SPxSolverBase<double>::performSolutionPolishing(SPxSolverBase<double> *this)

{
  uint n;
  uint n_00;
  int iVar1;
  Status *pSVar2;
  SPxOut *pSVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  Status SVar7;
  int iVar8;
  long lVar9;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *pCVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int i;
  double extraout_XMM0_Qa;
  Real RVar14;
  double extraout_XMM0_Qa_00;
  double dVar15;
  SPxId polishId;
  Verbosity old_verbosity;
  DIdxSet continuousvars;
  DataKey local_c8;
  DIdxSet local_c0;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *local_a0;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *local_98;
  undefined8 uStack_90;
  double local_88;
  undefined8 uStack_80;
  DIdxSet local_78;
  double local_58;
  ClassSet<soplex::SVSetBase<double>::DLPSV> *local_50;
  double local_48;
  
  bVar5 = false;
  if ((-1 < this->maxIters) && (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
    bVar5 = isTimeLimitReached(this,false);
    bVar5 = !bVar5;
  }
  if (((bVar5) || (this->polishObj == POLISH_OFF)) || (SVar7 = status(this), SVar7 != OPTIMAL)) {
    bVar5 = false;
  }
  else {
    pSVar2 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
    local_a0 = (ClassSet<soplex::SVSetBase<double>::DLPSV> *)
               (this->super_SPxBasisBase<double>).thedesc.colstat.data;
    local_c8.info = 0;
    local_c8.idx = -1;
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])(this);
    pSVar3 = this->spxout;
    local_48 = extraout_XMM0_Qa;
    if ((pSVar3 != (SPxOut *)0x0) && (3 < (int)pSVar3->m_verbosity)) {
      local_78.super_IdxSet._vptr_IdxSet._0_4_ = 4;
      local_c0.super_IdxSet._vptr_IdxSet._0_4_ = pSVar3->m_verbosity;
      (*pSVar3->_vptr_SPxOut[2])();
      pSVar3 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity]," --- perform solution polishing",0x1f);
      cVar4 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_c0);
    }
    if (this->theRep == COLUMN) {
      setType(this,ENTER);
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x76])(this);
      local_58 = entertol(this);
      this->instableEnter = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      if (this->polishObj == POLISH_INTEGRALITY) {
        n = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
            thenum;
        n_00 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum;
        DIdxSet::DIdxSet(&local_c0,n);
        DIdxSet::DIdxSet(&local_78,n_00);
        if (0 < (int)n) {
          uVar11 = 0;
          do {
            if ((pSVar2[uVar11] | D_ON_UPPER) == P_ON_UPPER) {
              local_98 = (ClassSet<soplex::SVSetBase<double>::DLPSV> *)
                         (this->theCoPvec->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11];
              uStack_90 = 0;
              RVar14 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              dVar15 = ABS((double)local_98);
              if (dVar15 <= 0.0) {
                dVar15 = 0.0;
              }
              if (dVar15 <= 1.0) {
                dVar15 = 1.0;
              }
              if (ABS((double)local_98 / dVar15) <= RVar14) {
                DIdxSet::addIdx(&local_c0,(int)uVar11);
              }
            }
            uVar11 = uVar11 + 1;
          } while (n != uVar11);
        }
        pCVar10 = local_a0;
        if (0 < (int)n_00 && (this->integerVariables).thesize == n_00) {
          uVar11 = 0;
          do {
            if ((*(uint *)((long)&pCVar10->theitem + uVar11 * 4) | 2) == 0xfffffffe) {
              local_98 = (ClassSet<soplex::SVSetBase<double>::DLPSV> *)
                         (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11];
              uStack_90 = 0;
              local_88 = (this->thePvec->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11];
              RVar14 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              dVar15 = ABS((double)local_98 - local_88);
              if (dVar15 <= 0.0) {
                dVar15 = 0.0;
              }
              if (dVar15 <= 1.0) {
                dVar15 = 1.0;
              }
              if ((ABS(((double)local_98 - local_88) / dVar15) <= RVar14) &&
                 ((this->integerVariables).data[uVar11] == 0)) {
                DIdxSet::addIdx(&local_78,(int)uVar11);
              }
            }
            uVar11 = uVar11 + 1;
          } while (n_00 != uVar11);
        }
        do {
          lVar13 = (long)local_c0.super_IdxSet.num;
          if ((lVar13 < 1) || (bVar5)) {
            iVar12 = 0;
          }
          else {
            iVar12 = 0;
            do {
              local_c8 = (DataKey)coId(this,local_c0.super_IdxSet.idx[lVar13 + -1]);
              bVar6 = enter(this,(SPxId *)&local_c8,true);
              (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar12 = iVar12 + 1;
                lVar9 = (long)local_c0.super_IdxSet.num;
                local_c0.super_IdxSet.num = local_c0.super_IdxSet.num + -1;
                local_c0.super_IdxSet.idx[lVar13 + -1] = local_c0.super_IdxSet.idx[lVar9 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
            } while ((1 < lVar13) && (lVar13 = lVar13 + -1, !bVar5));
          }
          lVar13 = (long)local_78.super_IdxSet.num;
          if (0 < lVar13) {
            while (!bVar5) {
              local_c8 = (DataKey)id(this,local_78.super_IdxSet.idx[lVar13 + -1]);
              bVar6 = enter(this,(SPxId *)&local_c8,true);
              (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar12 = iVar12 + 1;
                lVar9 = (long)local_78.super_IdxSet.num;
                local_78.super_IdxSet.num = local_78.super_IdxSet.num + -1;
                local_78.super_IdxSet.idx[lVar13 + -1] = local_78.super_IdxSet.idx[lVar9 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
              if (lVar13 < 2) break;
              lVar13 = lVar13 + -1;
            }
          }
          if (iVar12 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar12;
        } while (!bVar5);
        DIdxSet::~DIdxSet(&local_78);
      }
      else {
        DIdxSet::DIdxSet(&local_c0,(this->thecovectors->set).thenum);
        pCVar10 = local_a0;
        if (0 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
                set.thenum) {
          lVar13 = 0;
          do {
            if ((*(uint *)((long)&pCVar10->theitem + lVar13 * 4) | 2) == 0xfffffffe) {
              local_98 = (ClassSet<soplex::SVSetBase<double>::DLPSV> *)
                         (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar13];
              uStack_90 = 0;
              local_88 = (this->thePvec->super_VectorBase<double>).val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar13];
              RVar14 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr);
              dVar15 = ABS((double)local_98 - local_88);
              if (dVar15 <= 0.0) {
                dVar15 = 0.0;
              }
              if (dVar15 <= 1.0) {
                dVar15 = 1.0;
              }
              if (ABS(((double)local_98 - local_88) / dVar15) <= RVar14) {
                DIdxSet::addIdx(&local_c0,(int)lVar13);
              }
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < (this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                            super_SVSetBase<double>.set.thenum);
        }
        do {
          lVar13 = (long)local_c0.super_IdxSet.num;
          if ((lVar13 < 1) || (bVar5)) {
            iVar12 = 0;
          }
          else {
            iVar12 = 0;
            do {
              local_c8 = (DataKey)id(this,local_c0.super_IdxSet.idx[lVar13 + -1]);
              bVar6 = enter(this,(SPxId *)&local_c8,true);
              (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar12 = iVar12 + 1;
                lVar9 = (long)local_c0.super_IdxSet.num;
                local_c0.super_IdxSet.num = local_c0.super_IdxSet.num + -1;
                local_c0.super_IdxSet.idx[lVar13 + -1] = local_c0.super_IdxSet.idx[lVar9 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
            } while ((1 < lVar13) && (lVar13 = lVar13 + -1, !bVar5));
          }
          if (iVar12 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar12;
        } while (!bVar5);
      }
    }
    else {
      local_98 = (ClassSet<soplex::SVSetBase<double>::DLPSV> *)
                 &(this->super_SPxBasisBase<double>).thedesc.colstat.data;
      setType(this,LEAVE);
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x76])(this);
      local_58 = leavetol(this);
      this->instableLeave = false;
      (*this->theratiotester->_vptr_SPxRatioTester[9])
                (this->theratiotester,(ulong)(uint)this->theType);
      iVar12 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
               set.thenum;
      iVar1 = (this->integerVariables).thesize;
      if (this->polishObj == POLISH_INTEGRALITY) {
        DIdxSet::DIdxSet(&local_c0,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_a0 = (ClassSet<soplex::SVSetBase<double>::DLPSV> *)
                     &(this->super_SPxBasisBase<double>).thedesc.rowstat.data;
          local_50 = &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set;
          lVar13 = 0;
          do {
            local_c8 = (this->super_SPxBasisBase<double>).theBaseId.data[lVar13].super_DataKey;
            if (local_c8.info < 0) {
              iVar8 = SPxLPBase<double>::number(&this->super_SPxLPBase<double>,(SPxId *)&local_c8);
              pCVar10 = local_a0;
LAB_001d220b:
              if ((*(uint *)((long)&(pCVar10->theitem->data).super_SVectorBase<double>.m_elem +
                            (long)iVar8 * 4) & 0xfffffffd) == 0xfffffffc) {
                local_88 = (this->theFvec->super_VectorBase<double>).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar13];
                uStack_80 = 0;
                RVar14 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                dVar15 = ABS(local_88);
                if (dVar15 <= 0.0) {
                  dVar15 = 0.0;
                }
                if (dVar15 <= 1.0) {
                  dVar15 = 1.0;
                }
                if (ABS(local_88 / dVar15) <= RVar14) {
                  DIdxSet::addIdx(&local_c0,(int)lVar13);
                }
              }
            }
            else if (iVar1 == iVar12) {
              SPxColId::SPxColId((SPxColId *)&local_78,(SPxId *)&local_c8);
              iVar8 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                                (local_50,(DataKey *)&local_78);
              if ((this->integerVariables).data[iVar8] != 1) {
                iVar8 = SPxLPBase<double>::number(&this->super_SPxLPBase<double>,(SPxId *)&local_c8)
                ;
                pCVar10 = local_98;
                goto LAB_001d220b;
              }
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 < (this->thecovectors->set).thenum);
        }
        do {
          lVar13 = (long)local_c0.super_IdxSet.num;
          if ((lVar13 < 1) || (bVar5)) {
            iVar12 = 0;
          }
          else {
            iVar12 = 0;
            do {
              bVar6 = leave(this,local_c0.super_IdxSet.idx[lVar13 + -1],true);
              (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar12 = iVar12 + 1;
                lVar9 = (long)local_c0.super_IdxSet.num;
                local_c0.super_IdxSet.num = local_c0.super_IdxSet.num + -1;
                local_c0.super_IdxSet.idx[lVar13 + -1] = local_c0.super_IdxSet.idx[lVar9 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
            } while ((1 < lVar13) && (lVar13 = lVar13 + -1, !bVar5));
          }
          if (iVar12 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar12;
        } while (!bVar5);
      }
      else {
        DIdxSet::DIdxSet(&local_c0,(this->thecovectors->set).thenum);
        if (0 < (this->thecovectors->set).thenum) {
          local_a0 = &(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                      super_SVSetBase<double>.set;
          lVar13 = 0;
          do {
            local_c8 = (this->super_SPxBasisBase<double>).theBaseId.data[lVar13].super_DataKey;
            if (-1 < local_c8.info) {
              if (iVar1 == iVar12) {
                SPxColId::SPxColId((SPxColId *)&local_78,(SPxId *)&local_c8);
                iVar8 = ClassSet<soplex::SVSetBase<double>::DLPSV>::number
                                  (local_a0,(DataKey *)&local_78);
                if ((this->integerVariables).data[iVar8] == 0) goto LAB_001d260d;
              }
              if ((*(uint *)((long)&(local_98->theitem->data).super_SVectorBase<double>.m_elem +
                            lVar13 * 4) & 0xfffffffd) == 0xfffffffc) {
                local_88 = (this->theFvec->super_VectorBase<double>).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar13];
                uStack_80 = 0;
                RVar14 = Tolerances::epsilon((this->super_SPxLPBase<double>)._tolerances.
                                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr);
                dVar15 = ABS(local_88);
                if (dVar15 <= 0.0) {
                  dVar15 = 0.0;
                }
                if (dVar15 <= 1.0) {
                  dVar15 = 1.0;
                }
                if (ABS(local_88 / dVar15) <= RVar14) {
                  DIdxSet::addIdx(&local_c0,(int)lVar13);
                }
              }
            }
LAB_001d260d:
            lVar13 = lVar13 + 1;
          } while (lVar13 < (this->thecovectors->set).thenum);
        }
        do {
          lVar13 = (long)local_c0.super_IdxSet.num;
          if ((lVar13 < 1) || (bVar5)) {
            iVar12 = 0;
          }
          else {
            iVar12 = 0;
            do {
              bVar6 = leave(this,local_c0.super_IdxSet.idx[lVar13 + -1],true);
              (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x88])(this);
              if (bVar6) {
                iVar12 = iVar12 + 1;
                lVar9 = (long)local_c0.super_IdxSet.num;
                local_c0.super_IdxSet.num = local_c0.super_IdxSet.num + -1;
                local_c0.super_IdxSet.idx[lVar13 + -1] = local_c0.super_IdxSet.idx[lVar9 + -1];
                if ((-1 < this->maxIters) &&
                   (this->maxIters <= (this->super_SPxBasisBase<double>).iterCount)) {
                  bVar5 = true;
                }
              }
              bVar6 = isTimeLimitReached(this,false);
              if (bVar6) {
                bVar5 = true;
              }
            } while ((1 < lVar13) && (lVar13 = lVar13 + -1, !bVar5));
          }
          if (iVar12 == 0) {
            bVar5 = true;
          }
          this->polishCount = this->polishCount + iVar12;
        } while (!bVar5);
      }
    }
    DIdxSet::~DIdxSet(&local_c0);
    pSVar3 = this->spxout;
    if ((pSVar3 != (SPxOut *)0x0) && (2 < (int)pSVar3->m_verbosity)) {
      local_78.super_IdxSet._vptr_IdxSet._0_4_ = 3;
      local_c0.super_IdxSet._vptr_IdxSet._0_4_ = pSVar3->m_verbosity;
      (*pSVar3->_vptr_SPxOut[2])();
      pSVar3 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity]," --- finished solution polishing (",0x22);
      std::ostream::operator<<((ostream *)pSVar3->m_streams[pSVar3->m_verbosity],this->polishCount);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar3->m_streams[pSVar3->m_verbosity]," pivots)",8);
      cVar4 = (char)pSVar3->m_streams[pSVar3->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18)
                      + cVar4);
      std::ostream::put(cVar4);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_c0);
    }
    if ((this->super_SPxBasisBase<double>).thestatus != OPTIMAL) {
      (this->super_SPxBasisBase<double>).thestatus = OPTIMAL;
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x5e])(this);
    dVar15 = ABS(extraout_XMM0_Qa_00);
    if (ABS(extraout_XMM0_Qa_00) <= ABS(local_48)) {
      dVar15 = ABS(local_48);
    }
    if (dVar15 <= 1.0) {
      dVar15 = 1.0;
    }
    bVar5 = local_58 < ABS((extraout_XMM0_Qa_00 - local_48) / dVar15);
  }
  return bVar5;
}

Assistant:

bool SPxSolverBase<R>::performSolutionPolishing()
{
   // catch rare case that the iteration limit is exactly reached at optimality
   bool stop = (maxIters >= 0 && iterations() >= maxIters && !isTimeLimitReached());

   // only polish an already optimal basis
   if(stop || polishObj == POLISH_OFF || status() != OPTIMAL)
      return false;

   int nSuccessfulPivots;
   const typename SPxBasisBase<R>::Desc& ds = this->desc();
   const typename SPxBasisBase<R>::Desc::Status* rowstatus = ds.rowStatus();
   const typename SPxBasisBase<R>::Desc::Status* colstatus = ds.colStatus();
   typename SPxBasisBase<R>::Desc::Status stat;
   SPxId polishId;
   bool success = false;

   R alloweddeviation;
   R origval = value();

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- perform solution polishing" << std::endl;)

   if(rep() == COLUMN)
   {
      setType(ENTER); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = entertol();

      instableEnter = false;
      theratiotester->setType(type());

      int nrows = this->nRows();
      int ncols = this->nCols();

      assert(nrows >= 0);
      assert(ncols >= 0);

      if(polishObj == POLISH_INTEGRALITY)
      {
         DIdxSet slackcandidates(nrows);
         DIdxSet continuousvars(ncols);

         // collect nonbasic slack variables that could be made basic
         for(int i = 0; i < nrows; ++i)
         {
            // only check nonbasic rows, skip equations
            if(rowstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_LOWER
                  || rowstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider rows with zero dual multiplier to preserve optimality
               if(EQrel((*theCoPvec)[i], (R) 0, this->epsilon()))
                  slackcandidates.addIdx(i);
            }
         }

         // collect continuous variables that could be made basic
         if(integerVariables.size() == ncols)
         {
            for(int i = 0; i < ncols; ++i)
            {
               // skip fixed variables
               if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                     || colstatus[i] ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
               {
                  // only consider continuous variables with zero dual multiplier to preserve optimality
                  if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()) && integerVariables[i] == 0)
                     continuousvars.addIdx(i);
               }
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            // identify nonbasic slack variables, i.e. rows, that may be moved into the basis
            for(int i = slackcandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = coId(slackcandidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, rowstatus[slackcandidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  slackcandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // identify nonbasic variables that may be moved into the basis
            for(int i = continuousvars.size() - 1; i >= 0 && !stop; --i)
            {
               polishId = id(continuousvars.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[continuousvars.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  continuousvars.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet candidates(dim());

         // identify nonbasic variables, i.e. columns, that may be moved into the basis
         for(int i = 0; i < this->nCols() && !stop; ++i)
         {
            if(colstatus[i] == SPxBasisBase<R>::Desc::P_ON_LOWER
                  || colstatus[i] == SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               // only consider variables with zero reduced costs to preserve optimality
               if(EQrel(this->maxObj(i) - (*thePvec)[i], (R) 0, this->epsilon()))
                  candidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = candidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               polishId = id(candidates.index(i));
               SPxOut::debug(this, "try pivoting: {} stat: {}\n", polishId, colstatus[candidates.index(i)]);
               success = enter(polishId, true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  candidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }
   else
   {
      setType(LEAVE); // use primal simplex to preserve feasibility
      init();
      alloweddeviation = leavetol();
      instableLeave = false;
      theratiotester->setType(type());
      bool useIntegrality = false;
      int ncols = this->nCols();

      if(integerVariables.size() == ncols)
         useIntegrality = true;

      // in ROW rep: pivot slack out of the basis
      if(polishObj == POLISH_INTEGRALITY)
      {
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic candidates that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               stat = ds.rowStatus(this->number(polishId));
            else
            {
               // skip (integer) variables
               if(!useIntegrality || integerVariables[this->number(SPxColId(polishId))] == 1)
                  continue;

               stat = ds.colStatus(this->number(polishId));
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
      else
      {
         assert(polishObj == POLISH_FRACTIONALITY);
         assert(dim() >= 0);
         DIdxSet basiccandidates(dim());

         // collect basic (integer) variables, that may be moved out of the basis
         for(int i = 0; i < dim(); ++i)
         {
            polishId = this->baseId(i);

            if(polishId.isSPxRowId())
               continue;
            else
            {
               if(useIntegrality && integerVariables[this->number(SPxColId(polishId))] == 0)
                  continue;

               stat = ds.colStatus(i);
            }

            if(stat == SPxBasisBase<R>::Desc::P_ON_LOWER || stat ==  SPxBasisBase<R>::Desc::P_ON_UPPER)
            {
               if(EQrel((*theFvec)[i], (R) 0, this->epsilon()))
                  basiccandidates.addIdx(i);
            }
         }

         while(!stop)
         {
            nSuccessfulPivots = 0;

            for(int i = basiccandidates.size() - 1; i >= 0 && !stop; --i)
            {
               // coverity[forward_null]
               SPxOut::debug(this, "try pivoting: {}", this->baseId(basiccandidates.index(i)));
               success = leave(basiccandidates.index(i), true);
               clearUpdateVecs();

               if(success)
               {
                  SPxOut::debug(this, " -> success!");
                  ++nSuccessfulPivots;
                  basiccandidates.remove(i);

                  if(maxIters >= 0 && iterations() >= maxIters)
                     stop = true;
               }

               SPxOut::debug(this, "\n");

               if(isTimeLimitReached())
                  stop = true;
            }

            // terminate if in the last round no more polishing steps were performed
            if(nSuccessfulPivots == 0)
               stop = true;

            polishCount += nSuccessfulPivots;
         }
      }
   }

   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- finished solution polishing (" << polishCount << " pivots)" << std::endl;)

   this->setStatus(SPxBasisBase<R>::OPTIMAL);

   // if the value() changed significantly (due to numerics) reoptimize after polishing
   if(!EQrel(value(), origval, alloweddeviation))
      return true;
   else
      return false;
}